

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVP.cpp
# Opt level: O0

void __thiscall MT32Emu::TVP::nextPhase(TVP *this)

{
  PartialParam *partialParam;
  uint velocity;
  Bit32s BVar1;
  int iVar2;
  Poly *this_00;
  int local_24;
  int changeDuration;
  int envIndex;
  TVP *this_local;
  
  this->phase = this->phase + 1;
  if (this->phase == 6) {
    local_24 = 4;
  }
  else {
    local_24 = this->phase;
  }
  partialParam = this->partialParam;
  this_00 = Partial::getPoly(this->partial);
  velocity = Poly::getVelocity(this_00);
  BVar1 = calcTargetPitchOffsetWithoutLFO(partialParam,local_24,velocity);
  this->targetPitchOffsetWithoutLFO = BVar1;
  iVar2 = (uint)(this->partialParam->pitchEnv).time[local_24 + -1] -
          (int)this->timeKeyfollowSubtraction;
  if (iVar2 < 1) {
    targetPitchOffsetReached(this);
  }
  else {
    setupPitchChange(this,this->targetPitchOffsetWithoutLFO,(Bit8u)iVar2);
    updatePitch(this);
  }
  return;
}

Assistant:

void TVP::nextPhase() {
	phase++;
	int envIndex = phase == 6 ? 4 : phase;

	targetPitchOffsetWithoutLFO = calcTargetPitchOffsetWithoutLFO(partialParam, envIndex, partial->getPoly()->getVelocity()); // pitch we'll reach at the end

	int changeDuration = partialParam->pitchEnv.time[envIndex - 1];
	changeDuration -= timeKeyfollowSubtraction;
	if (changeDuration > 0) {
		setupPitchChange(targetPitchOffsetWithoutLFO, changeDuration); // changeDuration between 0 and 112 now
		updatePitch();
	} else {
		targetPitchOffsetReached();
	}
}